

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O0

FFSVarRec_conflict LookupVarByName(SstStream Stream,char *Name)

{
  int *piVar1;
  int iVar2;
  char *in_RSI;
  long in_RDI;
  int i;
  FFSReaderMarshalBase *Info;
  int local_24;
  
  piVar1 = *(int **)(in_RDI + 0x300);
  local_24 = 0;
  while( true ) {
    if (*piVar1 <= local_24) {
      return (FFSVarRec_conflict)0x0;
    }
    iVar2 = strcmp(*(char **)(*(long *)(*(long *)(piVar1 + 2) + (long)local_24 * 8) + 8),in_RSI);
    if (iVar2 == 0) break;
    local_24 = local_24 + 1;
  }
  return *(FFSVarRec_conflict *)(*(long *)(piVar1 + 2) + (long)local_24 * 8);
}

Assistant:

static FFSVarRec LookupVarByName(SstStream Stream, const char *Name)
{
    struct FFSReaderMarshalBase *Info = Stream->ReaderMarshalData;

    for (int i = 0; i < Info->VarCount; i++)
    {
        if (strcmp(Info->VarList[i]->VarName, Name) == 0)
        {
            return Info->VarList[i];
        }
    }

    return NULL;
}